

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvIntersector1Woop<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *this;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 (*pauVar25) [16];
  byte bVar26;
  bool bVar27;
  bool bVar28;
  int iVar29;
  long lVar30;
  byte bVar31;
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  undefined4 uVar35;
  ulong unaff_R12;
  size_t mask;
  long lVar36;
  byte bVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  undefined1 local_2490 [16];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  undefined1 local_23e0 [32];
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  undefined1 local_23a0 [8];
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_23a0 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_2398 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar50 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar42 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar50 = ZEXT1664(auVar42);
  }
  local_24c0 = *(float *)&(query->p).field_0;
  fStack_24bc = local_24c0;
  fStack_24b8 = local_24c0;
  fStack_24b4 = local_24c0;
  fStack_24b0 = local_24c0;
  fStack_24ac = local_24c0;
  fStack_24a8 = local_24c0;
  fStack_24a4 = local_24c0;
  local_24e0 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_24dc = local_24e0;
  fStack_24d8 = local_24e0;
  fStack_24d4 = local_24e0;
  fStack_24d0 = local_24e0;
  fStack_24cc = local_24e0;
  fStack_24c8 = local_24e0;
  fStack_24c4 = local_24e0;
  local_2500 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_24fc = local_2500;
  fStack_24f8 = local_2500;
  fStack_24f4 = local_2500;
  fStack_24f0 = local_2500;
  fStack_24ec = local_2500;
  fStack_24e8 = local_2500;
  fStack_24e4 = local_2500;
  uVar35 = *(undefined4 *)&(context->query_radius).field_0;
  auVar44._4_4_ = uVar35;
  auVar44._0_4_ = uVar35;
  auVar44._8_4_ = uVar35;
  auVar44._12_4_ = uVar35;
  auVar44._16_4_ = uVar35;
  auVar44._20_4_ = uVar35;
  auVar44._24_4_ = uVar35;
  auVar44._28_4_ = uVar35;
  uVar35 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar46._4_4_ = uVar35;
  auVar46._0_4_ = uVar35;
  auVar46._8_4_ = uVar35;
  auVar46._12_4_ = uVar35;
  auVar46._16_4_ = uVar35;
  auVar46._20_4_ = uVar35;
  auVar46._24_4_ = uVar35;
  auVar46._28_4_ = uVar35;
  uVar35 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar48._4_4_ = uVar35;
  auVar48._0_4_ = uVar35;
  auVar48._8_4_ = uVar35;
  auVar48._12_4_ = uVar35;
  auVar48._16_4_ = uVar35;
  auVar48._20_4_ = uVar35;
  auVar48._24_4_ = uVar35;
  auVar48._28_4_ = uVar35;
  pauVar38 = (undefined1 (*) [16])local_2390;
  bVar28 = false;
  do {
    auVar19._4_4_ = fStack_24bc;
    auVar19._0_4_ = local_24c0;
    auVar19._8_4_ = fStack_24b8;
    auVar19._12_4_ = fStack_24b4;
    auVar19._16_4_ = fStack_24b0;
    auVar19._20_4_ = fStack_24ac;
    auVar19._24_4_ = fStack_24a8;
    auVar19._28_4_ = fStack_24a4;
    local_23e0 = vsubps_avx(auVar19,auVar44);
    fVar5 = auVar44._0_4_;
    fVar6 = auVar44._4_4_;
    fVar7 = auVar44._8_4_;
    fVar8 = auVar44._12_4_;
    fVar9 = auVar44._16_4_;
    fVar10 = auVar44._20_4_;
    fVar11 = auVar44._24_4_;
    local_2400 = local_24c0 + fVar5;
    fStack_23fc = fStack_24bc + fVar6;
    fStack_23f8 = fStack_24b8 + fVar7;
    fStack_23f4 = fStack_24b4 + fVar8;
    fStack_23f0 = fStack_24b0 + fVar9;
    fStack_23ec = fStack_24ac + fVar10;
    fStack_23e8 = fStack_24a8 + fVar11;
    fStack_23e4 = fStack_24a4 + auVar44._28_4_;
    auVar14._4_4_ = fStack_24dc;
    auVar14._0_4_ = local_24e0;
    auVar14._8_4_ = fStack_24d8;
    auVar14._12_4_ = fStack_24d4;
    auVar14._16_4_ = fStack_24d0;
    auVar14._20_4_ = fStack_24cc;
    auVar14._24_4_ = fStack_24c8;
    auVar14._28_4_ = fStack_24c4;
    local_2420 = vsubps_avx(auVar14,auVar46);
    local_2440 = local_24e0 + auVar46._0_4_;
    fStack_243c = fStack_24dc + auVar46._4_4_;
    fStack_2438 = fStack_24d8 + auVar46._8_4_;
    fStack_2434 = fStack_24d4 + auVar46._12_4_;
    fStack_2430 = fStack_24d0 + auVar46._16_4_;
    fStack_242c = fStack_24cc + auVar46._20_4_;
    fStack_2428 = fStack_24c8 + auVar46._24_4_;
    fStack_2424 = fStack_24c4 + auVar46._28_4_;
    auVar13._4_4_ = fStack_24fc;
    auVar13._0_4_ = local_2500;
    auVar13._8_4_ = fStack_24f8;
    auVar13._12_4_ = fStack_24f4;
    auVar13._16_4_ = fStack_24f0;
    auVar13._20_4_ = fStack_24ec;
    auVar13._24_4_ = fStack_24e8;
    auVar13._28_4_ = fStack_24e4;
    local_2460 = vsubps_avx(auVar13,auVar48);
    local_2480._0_4_ = local_2500 + auVar48._0_4_;
    local_2480._4_4_ = fStack_24fc + auVar48._4_4_;
    local_2480._8_4_ = fStack_24f8 + auVar48._8_4_;
    local_2480._12_4_ = fStack_24f4 + auVar48._12_4_;
    local_2480._16_4_ = fStack_24f0 + auVar48._16_4_;
    local_2480._20_4_ = fStack_24ec + auVar48._20_4_;
    local_2480._24_4_ = fStack_24e8 + auVar48._24_4_;
    local_2480._28_4_ = fStack_24e4 + auVar48._28_4_;
    local_23c0 = fVar5 * fVar5;
    fStack_23bc = fVar6 * fVar6;
    fStack_23b8 = fVar7 * fVar7;
    fStack_23b4 = fVar8 * fVar8;
    fStack_23b0 = fVar9 * fVar9;
    fStack_23ac = fVar10 * fVar10;
    fStack_23a8 = fVar11 * fVar11;
    fStack_23a4 = auVar44._28_4_;
    local_2490 = auVar50._0_16_;
    do {
      do {
        do {
          if (pauVar38 == (undefined1 (*) [16])local_23a0) {
            return bVar28;
          }
          pauVar25 = pauVar38 + -1;
          pauVar38 = pauVar38 + -1;
        } while (auVar50._0_4_ < *(float *)(*pauVar25 + 8));
        uVar40 = *(ulong *)*pauVar38;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar40 & 8) == 0) {
              auVar20._4_4_ = fStack_24bc;
              auVar20._0_4_ = local_24c0;
              auVar20._8_4_ = fStack_24b8;
              auVar20._12_4_ = fStack_24b4;
              auVar20._16_4_ = fStack_24b0;
              auVar20._20_4_ = fStack_24ac;
              auVar20._24_4_ = fStack_24a8;
              auVar20._28_4_ = fStack_24a4;
              auVar44 = vmaxps_avx(auVar20,*(undefined1 (*) [32])(uVar40 + 0x40));
              auVar44 = vminps_avx(auVar44,*(undefined1 (*) [32])(uVar40 + 0x60));
              auVar48 = vsubps_avx(auVar44,auVar20);
              auVar17._4_4_ = fStack_24dc;
              auVar17._0_4_ = local_24e0;
              auVar17._8_4_ = fStack_24d8;
              auVar17._12_4_ = fStack_24d4;
              auVar17._16_4_ = fStack_24d0;
              auVar17._20_4_ = fStack_24cc;
              auVar17._24_4_ = fStack_24c8;
              auVar17._28_4_ = fStack_24c4;
              auVar44 = vmaxps_avx(auVar17,*(undefined1 (*) [32])(uVar40 + 0x80));
              auVar46 = vminps_avx(auVar44,*(undefined1 (*) [32])(uVar40 + 0xa0));
              auVar15._4_4_ = fStack_24fc;
              auVar15._0_4_ = local_2500;
              auVar15._8_4_ = fStack_24f8;
              auVar15._12_4_ = fStack_24f4;
              auVar15._16_4_ = fStack_24f0;
              auVar15._20_4_ = fStack_24ec;
              auVar15._24_4_ = fStack_24e8;
              auVar15._28_4_ = fStack_24e4;
              auVar44 = vmaxps_avx(auVar15,*(undefined1 (*) [32])(uVar40 + 0xc0));
              auVar44 = vminps_avx(auVar44,*(undefined1 (*) [32])(uVar40 + 0xe0));
              auVar46 = vsubps_avx(auVar46,auVar17);
              auVar44 = vsubps_avx(auVar44,auVar15);
              local_2520._0_4_ =
                   auVar48._0_4_ * auVar48._0_4_ + auVar46._0_4_ * auVar46._0_4_ +
                   auVar44._0_4_ * auVar44._0_4_;
              local_2520._4_4_ =
                   auVar48._4_4_ * auVar48._4_4_ + auVar46._4_4_ * auVar46._4_4_ +
                   auVar44._4_4_ * auVar44._4_4_;
              fStack_2518 = auVar48._8_4_ * auVar48._8_4_ + auVar46._8_4_ * auVar46._8_4_ +
                            auVar44._8_4_ * auVar44._8_4_;
              fStack_2514 = auVar48._12_4_ * auVar48._12_4_ + auVar46._12_4_ * auVar46._12_4_ +
                            auVar44._12_4_ * auVar44._12_4_;
              fStack_2510 = auVar48._16_4_ * auVar48._16_4_ + auVar46._16_4_ * auVar46._16_4_ +
                            auVar44._16_4_ * auVar44._16_4_;
              fStack_250c = auVar48._20_4_ * auVar48._20_4_ + auVar46._20_4_ * auVar46._20_4_ +
                            auVar44._20_4_ * auVar44._20_4_;
              fStack_2508 = auVar48._24_4_ * auVar48._24_4_ + auVar46._24_4_ * auVar46._24_4_ +
                            auVar44._24_4_ * auVar44._24_4_;
              fStack_2504 = auVar48._28_4_ + auVar46._28_4_ + auVar46._28_4_;
              auVar24._4_4_ = fStack_23bc;
              auVar24._0_4_ = local_23c0;
              auVar24._8_4_ = fStack_23b8;
              auVar24._12_4_ = fStack_23b4;
              auVar24._16_4_ = fStack_23b0;
              auVar24._20_4_ = fStack_23ac;
              auVar24._24_4_ = fStack_23a8;
              auVar24._28_4_ = fStack_23a4;
              auVar44 = vcmpps_avx(_local_2520,auVar24,2);
              auVar46 = vcmpps_avx(*(undefined1 (*) [32])(uVar40 + 0x40),
                                   *(undefined1 (*) [32])(uVar40 + 0x60),2);
              auVar44 = vandps_avx(auVar44,auVar46);
LAB_015af463:
              uVar35 = vmovmskps_avx(auVar44);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar35);
            }
          }
          else if ((uVar40 & 8) == 0) {
            auVar44 = *(undefined1 (*) [32])(uVar40 + 0x40);
            auVar46 = *(undefined1 (*) [32])(uVar40 + 0x60);
            auVar21._4_4_ = fStack_24bc;
            auVar21._0_4_ = local_24c0;
            auVar21._8_4_ = fStack_24b8;
            auVar21._12_4_ = fStack_24b4;
            auVar21._16_4_ = fStack_24b0;
            auVar21._20_4_ = fStack_24ac;
            auVar21._24_4_ = fStack_24a8;
            auVar21._28_4_ = fStack_24a4;
            auVar48 = vmaxps_avx(auVar21,auVar44);
            auVar48 = vminps_avx(auVar48,auVar46);
            auVar13 = vsubps_avx(auVar48,auVar21);
            auVar18._4_4_ = fStack_24dc;
            auVar18._0_4_ = local_24e0;
            auVar18._8_4_ = fStack_24d8;
            auVar18._12_4_ = fStack_24d4;
            auVar18._16_4_ = fStack_24d0;
            auVar18._20_4_ = fStack_24cc;
            auVar18._24_4_ = fStack_24c8;
            auVar18._28_4_ = fStack_24c4;
            auVar48 = vmaxps_avx(auVar18,*(undefined1 (*) [32])(uVar40 + 0x80));
            auVar48 = vminps_avx(auVar48,*(undefined1 (*) [32])(uVar40 + 0xa0));
            auVar14 = vsubps_avx(auVar48,auVar18);
            auVar16._4_4_ = fStack_24fc;
            auVar16._0_4_ = local_2500;
            auVar16._8_4_ = fStack_24f8;
            auVar16._12_4_ = fStack_24f4;
            auVar16._16_4_ = fStack_24f0;
            auVar16._20_4_ = fStack_24ec;
            auVar16._24_4_ = fStack_24e8;
            auVar16._28_4_ = fStack_24e4;
            auVar48 = vmaxps_avx(auVar16,*(undefined1 (*) [32])(uVar40 + 0xc0));
            auVar48 = vminps_avx(auVar48,*(undefined1 (*) [32])(uVar40 + 0xe0));
            auVar48 = vsubps_avx(auVar48,auVar16);
            local_2520._4_4_ =
                 auVar13._4_4_ * auVar13._4_4_ + auVar14._4_4_ * auVar14._4_4_ +
                 auVar48._4_4_ * auVar48._4_4_;
            local_2520._0_4_ =
                 auVar13._0_4_ * auVar13._0_4_ + auVar14._0_4_ * auVar14._0_4_ +
                 auVar48._0_4_ * auVar48._0_4_;
            fStack_2518 = auVar13._8_4_ * auVar13._8_4_ + auVar14._8_4_ * auVar14._8_4_ +
                          auVar48._8_4_ * auVar48._8_4_;
            fStack_2514 = auVar13._12_4_ * auVar13._12_4_ + auVar14._12_4_ * auVar14._12_4_ +
                          auVar48._12_4_ * auVar48._12_4_;
            fStack_2510 = auVar13._16_4_ * auVar13._16_4_ + auVar14._16_4_ * auVar14._16_4_ +
                          auVar48._16_4_ * auVar48._16_4_;
            fStack_250c = auVar13._20_4_ * auVar13._20_4_ + auVar14._20_4_ * auVar14._20_4_ +
                          auVar48._20_4_ * auVar48._20_4_;
            fStack_2508 = auVar13._24_4_ * auVar13._24_4_ + auVar14._24_4_ * auVar14._24_4_ +
                          auVar48._24_4_ * auVar48._24_4_;
            fStack_2504 = auVar13._28_4_ + auVar14._28_4_ + auVar48._28_4_;
            auVar23._4_4_ = fStack_23fc;
            auVar23._0_4_ = local_2400;
            auVar23._8_4_ = fStack_23f8;
            auVar23._12_4_ = fStack_23f4;
            auVar23._16_4_ = fStack_23f0;
            auVar23._20_4_ = fStack_23ec;
            auVar23._24_4_ = fStack_23e8;
            auVar23._28_4_ = fStack_23e4;
            auVar48 = vcmpps_avx(auVar44,auVar23,2);
            auVar22._4_4_ = fStack_243c;
            auVar22._0_4_ = local_2440;
            auVar22._8_4_ = fStack_2438;
            auVar22._12_4_ = fStack_2434;
            auVar22._16_4_ = fStack_2430;
            auVar22._20_4_ = fStack_242c;
            auVar22._24_4_ = fStack_2428;
            auVar22._28_4_ = fStack_2424;
            auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar40 + 0x80),auVar22,2);
            auVar48 = vandps_avx(auVar13,auVar48);
            auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar40 + 0xc0),local_2480,2);
            auVar14 = vcmpps_avx(auVar46,local_23e0,5);
            auVar13 = vandps_avx(auVar13,auVar14);
            auVar48 = vandps_avx(auVar48,auVar13);
            auVar44 = vcmpps_avx(auVar44,auVar46,2);
            auVar46 = vcmpps_avx(*(undefined1 (*) [32])(uVar40 + 0xa0),local_2420,5);
            auVar44 = vandps_avx(auVar44,auVar46);
            auVar46 = vcmpps_avx(*(undefined1 (*) [32])(uVar40 + 0xe0),local_2460,5);
            auVar44 = vandps_avx(auVar44,auVar46);
            auVar44 = vandps_avx(auVar48,auVar44);
            goto LAB_015af463;
          }
          if ((uVar40 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar29 = 4;
            }
            else {
              uVar39 = uVar40 & 0xfffffffffffffff0;
              lVar30 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              iVar29 = 0;
              uVar40 = *(ulong *)(uVar39 + lVar30 * 8);
              uVar34 = unaff_R12 - 1 & unaff_R12;
              if (uVar34 != 0) {
                uVar3 = *(uint *)(local_2520 + lVar30 * 4);
                lVar30 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar39 + lVar30 * 8);
                uVar2 = *(uint *)(local_2520 + lVar30 * 4);
                uVar34 = uVar34 - 1 & uVar34;
                if (uVar34 == 0) {
                  if (uVar3 < uVar2) {
                    *(ulong *)*pauVar38 = uVar4;
                    *(uint *)(*pauVar38 + 8) = uVar2;
                    pauVar38 = pauVar38 + 1;
                  }
                  else {
                    *(ulong *)*pauVar38 = uVar40;
                    *(uint *)(*pauVar38 + 8) = uVar3;
                    pauVar38 = pauVar38 + 1;
                    uVar40 = uVar4;
                  }
                }
                else {
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = uVar40;
                  auVar42 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar3));
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = uVar4;
                  auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar2));
                  lVar30 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                    }
                  }
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = *(ulong *)(uVar39 + lVar30 * 8);
                  auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_2520 + lVar30 * 4)));
                  uVar34 = uVar34 - 1 & uVar34;
                  if (uVar34 == 0) {
                    auVar49 = vpcmpgtd_avx(auVar45,auVar42);
                    auVar43 = vpshufd_avx(auVar49,0xaa);
                    auVar49 = vblendvps_avx(auVar45,auVar42,auVar43);
                    auVar42 = vblendvps_avx(auVar42,auVar45,auVar43);
                    auVar45 = vpcmpgtd_avx(auVar47,auVar49);
                    auVar43 = vpshufd_avx(auVar45,0xaa);
                    auVar45 = vblendvps_avx(auVar47,auVar49,auVar43);
                    auVar47 = vblendvps_avx(auVar49,auVar47,auVar43);
                    auVar49 = vpcmpgtd_avx(auVar47,auVar42);
                    auVar43 = vpshufd_avx(auVar49,0xaa);
                    auVar49 = vblendvps_avx(auVar47,auVar42,auVar43);
                    auVar42 = vblendvps_avx(auVar42,auVar47,auVar43);
                    *pauVar38 = auVar42;
                    pauVar38[1] = auVar49;
                    pauVar38 = pauVar38 + 2;
                    uVar40 = auVar45._0_8_;
                  }
                  else {
                    lVar30 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                      }
                    }
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = *(ulong *)(uVar39 + lVar30 * 8);
                    auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_2520 + lVar30 * 4)));
                    uVar34 = uVar34 - 1 & uVar34;
                    iVar29 = 0;
                    if (uVar34 == 0) {
                      auVar43 = vpcmpgtd_avx(auVar45,auVar42);
                      auVar12 = vpshufd_avx(auVar43,0xaa);
                      auVar43 = vblendvps_avx(auVar45,auVar42,auVar12);
                      auVar42 = vblendvps_avx(auVar42,auVar45,auVar12);
                      auVar45 = vpcmpgtd_avx(auVar49,auVar47);
                      auVar12 = vpshufd_avx(auVar45,0xaa);
                      auVar45 = vblendvps_avx(auVar49,auVar47,auVar12);
                      auVar47 = vblendvps_avx(auVar47,auVar49,auVar12);
                      auVar49 = vpcmpgtd_avx(auVar47,auVar42);
                      auVar12 = vpshufd_avx(auVar49,0xaa);
                      auVar49 = vblendvps_avx(auVar47,auVar42,auVar12);
                      auVar42 = vblendvps_avx(auVar42,auVar47,auVar12);
                      auVar47 = vpcmpgtd_avx(auVar45,auVar43);
                      auVar12 = vpshufd_avx(auVar47,0xaa);
                      auVar47 = vblendvps_avx(auVar45,auVar43,auVar12);
                      auVar45 = vblendvps_avx(auVar43,auVar45,auVar12);
                      auVar43 = vpcmpgtd_avx(auVar49,auVar45);
                      auVar12 = vpshufd_avx(auVar43,0xaa);
                      auVar43 = vblendvps_avx(auVar49,auVar45,auVar12);
                      auVar45 = vblendvps_avx(auVar45,auVar49,auVar12);
                      *pauVar38 = auVar42;
                      pauVar38[1] = auVar45;
                      pauVar38[2] = auVar43;
                      pauVar38 = pauVar38 + 3;
                      uVar40 = auVar47._0_8_;
                    }
                    else {
                      *pauVar38 = auVar42;
                      pauVar38[1] = auVar45;
                      pauVar38[2] = auVar47;
                      pauVar38[3] = auVar49;
                      lVar30 = 0x30;
                      do {
                        lVar41 = lVar30;
                        lVar30 = 0;
                        if (uVar34 != 0) {
                          for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                          }
                        }
                        auVar43._8_8_ = 0;
                        auVar43._0_8_ = *(ulong *)(uVar39 + lVar30 * 8);
                        auVar42 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_2520 + lVar30 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(pauVar38[1] + lVar41) = auVar42;
                        uVar34 = uVar34 & uVar34 - 1;
                        lVar30 = lVar41 + 0x10;
                      } while (uVar34 != 0);
                      pauVar25 = (undefined1 (*) [16])(pauVar38[1] + lVar41);
                      if (lVar41 + 0x10 != 0) {
                        lVar30 = 0x10;
                        pauVar32 = pauVar38;
                        do {
                          auVar42 = pauVar32[1];
                          uVar3 = *(uint *)(pauVar32[1] + 8);
                          pauVar32 = pauVar32 + 1;
                          lVar41 = lVar30;
                          do {
                            if (uVar3 <= *(uint *)(pauVar38[-1] + lVar41 + 8)) {
                              pauVar33 = (undefined1 (*) [16])(*pauVar38 + lVar41);
                              break;
                            }
                            *(undefined1 (*) [16])(*pauVar38 + lVar41) =
                                 *(undefined1 (*) [16])(pauVar38[-1] + lVar41);
                            lVar41 = lVar41 + -0x10;
                            pauVar33 = pauVar38;
                          } while (lVar41 != 0);
                          *pauVar33 = auVar42;
                          lVar30 = lVar30 + 0x10;
                        } while (pauVar25 != pauVar32);
                      }
                      pauVar38 = pauVar25;
                      uVar40 = *(ulong *)*pauVar25;
                    }
                  }
                }
              }
            }
          }
          else {
            iVar29 = 6;
          }
        } while (iVar29 == 0);
      } while ((iVar29 != 6) || (uVar39 = (ulong)((uint)uVar40 & 0xf), uVar39 == 8));
      lVar41 = (uVar40 & 0xfffffffffffffff0) + 0xa0;
      lVar30 = 0;
      bVar26 = 0;
      do {
        bVar31 = bVar26;
        lVar36 = -4;
        bVar37 = 0;
        do {
          uVar3 = *(uint *)(lVar41 + lVar36 * 4);
          if ((ulong)uVar3 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar3].ptr;
          context->geomID = uVar3;
          context->primID = *(uint *)(lVar41 + 0x10 + lVar36 * 4);
          bVar27 = Geometry::pointQuery(this,query,context);
          bVar37 = bVar37 | bVar27;
          lVar36 = lVar36 + 1;
        } while (lVar36 != 0);
        lVar30 = lVar30 + 1;
        lVar41 = lVar41 + 0xb0;
        bVar26 = bVar31 | bVar37;
      } while (lVar30 != uVar39 - 8);
      auVar50 = ZEXT1664(local_2490);
    } while (bVar31 == 0 && bVar37 == 0);
    uVar35 = *(undefined4 *)&(context->query_radius).field_0;
    auVar44._4_4_ = uVar35;
    auVar44._0_4_ = uVar35;
    auVar44._8_4_ = uVar35;
    auVar44._12_4_ = uVar35;
    auVar44._16_4_ = uVar35;
    auVar44._20_4_ = uVar35;
    auVar44._24_4_ = uVar35;
    auVar44._28_4_ = uVar35;
    uVar35 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar46._4_4_ = uVar35;
    auVar46._0_4_ = uVar35;
    auVar46._8_4_ = uVar35;
    auVar46._12_4_ = uVar35;
    auVar46._16_4_ = uVar35;
    auVar46._20_4_ = uVar35;
    auVar46._24_4_ = uVar35;
    auVar46._28_4_ = uVar35;
    uVar35 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar48._4_4_ = uVar35;
    auVar48._0_4_ = uVar35;
    auVar48._8_4_ = uVar35;
    auVar48._12_4_ = uVar35;
    auVar48._16_4_ = uVar35;
    auVar48._20_4_ = uVar35;
    auVar48._24_4_ = uVar35;
    auVar48._28_4_ = uVar35;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar50 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar1 = (context->query_radius).field_0;
      auVar42 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
      auVar50 = ZEXT1664(auVar42);
    }
    bVar28 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }